

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O2

int32_t icu_63::anon_unknown_9::appendUnchanged
                  (UChar *dest,int32_t destIndex,int32_t destCapacity,UChar *s,int32_t length,
                  uint32_t options,Edits *edits)

{
  int iVar1;
  
  iVar1 = destIndex;
  if (0 < length) {
    if (edits != (Edits *)0x0) {
      Edits::addUnchanged(edits,length);
    }
    if ((options >> 0xe & 1) == 0) {
      if ((destIndex ^ 0x7fffffffU) < (uint)length) {
        iVar1 = -1;
      }
      else {
        iVar1 = length + destIndex;
        if (iVar1 <= destCapacity) {
          u_memcpy_63(dest + destIndex,s,length);
        }
      }
    }
  }
  return iVar1;
}

Assistant:

inline int32_t
appendUnchanged(UChar *dest, int32_t destIndex, int32_t destCapacity,
                const UChar *s, int32_t length, uint32_t options, icu::Edits *edits) {
    if (length <= 0) {
        return destIndex;
    }
    return appendNonEmptyUnchanged(dest, destIndex, destCapacity, s, length, options, edits);
}